

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O1

TestCaseGroup * vkt::pipeline::createInputAssemblyTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *description;
  uint uVar1;
  VkPrimitiveTopology primitiveTopology;
  TestNode *this;
  TestNode *pTVar2;
  TestNode *pTVar3;
  TestNode *this_00;
  PrimitiveRestartTest *pPVar4;
  VkPrimitiveTopology topology;
  VkPrimitiveTopology topology_00;
  VkPrimitiveTopology topology_01;
  long lVar5;
  string local_70;
  string local_50;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"input_assembly","Input assembly tests");
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,"primitive_topology","");
  description = &local_70.field_2;
  lVar5 = 0;
  do {
    uVar1 = *(uint *)((long)&(anonymous_namespace)::InputAssemblyTest::s_primitiveTopologies + lVar5
                     );
    pTVar3 = (TestNode *)operator_new(0x80);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)uVar1,topology);
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)description;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,testCtx,local_50._M_dataplus._M_p,description->_M_local_buf);
    *(uint *)&pTVar3[1]._vptr_TestNode = uVar1;
    *(undefined4 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 10;
    *(undefined1 *)&pTVar3[1].m_testCtx = 0;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 1;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d58568;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != description) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x28);
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"primitive_restart","Restarts indices of ");
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,testCtx,"index_type_uint16","");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,"index_type_uint32","");
  lVar5 = 0;
  do {
    primitiveTopology = *(VkPrimitiveTopology *)((long)&DAT_00b15f40 + lVar5);
    pPVar4 = (PrimitiveRestartTest *)operator_new(0x98);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)primitiveTopology,topology_00);
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)description;
    anon_unknown_0::PrimitiveRestartTest::PrimitiveRestartTest
              (pPVar4,testCtx,&local_50,&local_70,primitiveTopology,VK_INDEX_TYPE_UINT16);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != description) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pPVar4 = (PrimitiveRestartTest *)operator_new(0x98);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)primitiveTopology,topology_01);
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)description;
    anon_unknown_0::PrimitiveRestartTest::PrimitiveRestartTest
              (pPVar4,testCtx,&local_50,&local_70,primitiveTopology,VK_INDEX_TYPE_UINT32);
    tcu::TestNode::addChild(this_00,(TestNode *)pPVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != description) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x14);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  tcu::TestNode::addChild(pTVar2,this_00);
  tcu::TestNode::addChild(this,pTVar2);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createInputAssemblyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>		inputAssemblyTests (new tcu::TestCaseGroup(testCtx, "input_assembly", "Input assembly tests"));

	inputAssemblyTests->addChild(createPrimitiveTopologyTests(testCtx).release());
	inputAssemblyTests->addChild(createPrimitiveRestartTests(testCtx).release());

	return inputAssemblyTests.release();
}